

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O2

bool __thiscall
DNSResolve::ParseResponse
          (DNSResolve *this,char *recv_data,string *hostname,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ip_result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cname_result)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  bool bVar4;
  char *encoded_str;
  in_addr_t *encoded_str_00;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint16_t encoded_name_len;
  allocator local_105;
  in_addr addr;
  char ip_str [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char dot_name [128];
  
  dot_name[0x70] = '\0';
  dot_name[0x71] = '\0';
  dot_name[0x72] = '\0';
  dot_name[0x73] = '\0';
  dot_name[0x74] = '\0';
  dot_name[0x75] = '\0';
  dot_name[0x76] = '\0';
  dot_name[0x77] = '\0';
  dot_name[0x78] = '\0';
  dot_name[0x79] = '\0';
  dot_name[0x7a] = '\0';
  dot_name[0x7b] = '\0';
  dot_name[0x7c] = '\0';
  dot_name[0x7d] = '\0';
  dot_name[0x7e] = '\0';
  dot_name[0x7f] = '\0';
  dot_name[0x60] = '\0';
  dot_name[0x61] = '\0';
  dot_name[0x62] = '\0';
  dot_name[99] = '\0';
  dot_name[100] = '\0';
  dot_name[0x65] = '\0';
  dot_name[0x66] = '\0';
  dot_name[0x67] = '\0';
  dot_name[0x68] = '\0';
  dot_name[0x69] = '\0';
  dot_name[0x6a] = '\0';
  dot_name[0x6b] = '\0';
  dot_name[0x6c] = '\0';
  dot_name[0x6d] = '\0';
  dot_name[0x6e] = '\0';
  dot_name[0x6f] = '\0';
  dot_name[0x50] = '\0';
  dot_name[0x51] = '\0';
  dot_name[0x52] = '\0';
  dot_name[0x53] = '\0';
  dot_name[0x54] = '\0';
  dot_name[0x55] = '\0';
  dot_name[0x56] = '\0';
  dot_name[0x57] = '\0';
  dot_name[0x58] = '\0';
  dot_name[0x59] = '\0';
  dot_name[0x5a] = '\0';
  dot_name[0x5b] = '\0';
  dot_name[0x5c] = '\0';
  dot_name[0x5d] = '\0';
  dot_name[0x5e] = '\0';
  dot_name[0x5f] = '\0';
  dot_name[0x40] = '\0';
  dot_name[0x41] = '\0';
  dot_name[0x42] = '\0';
  dot_name[0x43] = '\0';
  dot_name[0x44] = '\0';
  dot_name[0x45] = '\0';
  dot_name[0x46] = '\0';
  dot_name[0x47] = '\0';
  dot_name[0x48] = '\0';
  dot_name[0x49] = '\0';
  dot_name[0x4a] = '\0';
  dot_name[0x4b] = '\0';
  dot_name[0x4c] = '\0';
  dot_name[0x4d] = '\0';
  dot_name[0x4e] = '\0';
  dot_name[0x4f] = '\0';
  dot_name[0x30] = '\0';
  dot_name[0x31] = '\0';
  dot_name[0x32] = '\0';
  dot_name[0x33] = '\0';
  dot_name[0x34] = '\0';
  dot_name[0x35] = '\0';
  dot_name[0x36] = '\0';
  dot_name[0x37] = '\0';
  dot_name[0x38] = '\0';
  dot_name[0x39] = '\0';
  dot_name[0x3a] = '\0';
  dot_name[0x3b] = '\0';
  dot_name[0x3c] = '\0';
  dot_name[0x3d] = '\0';
  dot_name[0x3e] = '\0';
  dot_name[0x3f] = '\0';
  dot_name[0x20] = '\0';
  dot_name[0x21] = '\0';
  dot_name[0x22] = '\0';
  dot_name[0x23] = '\0';
  dot_name[0x24] = '\0';
  dot_name[0x25] = '\0';
  dot_name[0x26] = '\0';
  dot_name[0x27] = '\0';
  dot_name[0x28] = '\0';
  dot_name[0x29] = '\0';
  dot_name[0x2a] = '\0';
  dot_name[0x2b] = '\0';
  dot_name[0x2c] = '\0';
  dot_name[0x2d] = '\0';
  dot_name[0x2e] = '\0';
  dot_name[0x2f] = '\0';
  dot_name[0x10] = '\0';
  dot_name[0x11] = '\0';
  dot_name[0x12] = '\0';
  dot_name[0x13] = '\0';
  dot_name[0x14] = '\0';
  dot_name[0x15] = '\0';
  dot_name[0x16] = '\0';
  dot_name[0x17] = '\0';
  dot_name[0x18] = '\0';
  dot_name[0x19] = '\0';
  dot_name[0x1a] = '\0';
  dot_name[0x1b] = '\0';
  dot_name[0x1c] = '\0';
  dot_name[0x1d] = '\0';
  dot_name[0x1e] = '\0';
  dot_name[0x1f] = '\0';
  dot_name[0] = '\0';
  dot_name[1] = '\0';
  dot_name[2] = '\0';
  dot_name[3] = '\0';
  dot_name[4] = '\0';
  dot_name[5] = '\0';
  dot_name[6] = '\0';
  dot_name[7] = '\0';
  dot_name[8] = '\0';
  dot_name[9] = '\0';
  dot_name[10] = '\0';
  dot_name[0xb] = '\0';
  dot_name[0xc] = '\0';
  dot_name[0xd] = '\0';
  dot_name[0xe] = '\0';
  dot_name[0xf] = '\0';
  encoded_name_len = 0;
  bVar7 = true;
  if (((*(ushort *)(recv_data + 2) & 0x7ffb) == 0x81) &&
     (uVar1 = *(ushort *)(recv_data + 6), uVar1 != 0)) {
    uVar6 = (uint)(ushort)(*(ushort *)(recv_data + 4) << 8 | *(ushort *)(recv_data + 4) >> 8);
    uVar5 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    encoded_str = recv_data + 0xc;
    while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
      bVar7 = DecodeDotStr(this,encoded_str,&encoded_name_len,dot_name,0x80,(char *)0x0);
      if (!bVar7) {
        return false;
      }
      if ((hostname->_M_string_length == 0) && (dot_name[0] != '\0')) {
        std::__cxx11::string::assign((char *)hostname);
      }
      encoded_str = encoded_str +
                    (ulong)this->kDnsTypeSize + (ulong)encoded_name_len + (ulong)this->kDnsClassSzie
      ;
    }
    while( true ) {
      bVar7 = uVar5 == 0;
      uVar5 = uVar5 - 1;
      if ((bVar7) ||
         (bVar4 = DecodeDotStr(this,encoded_str,&encoded_name_len,dot_name,0x80,recv_data), !bVar4))
      break;
      uVar1 = *(ushort *)(encoded_str + encoded_name_len);
      lVar3 = (ulong)this->kDnsClassSzie + (ulong)this->kDnsTypeSize + (ulong)encoded_name_len;
      uVar2 = *(ushort *)(encoded_str + (ulong)this->kDnsTtlSize + lVar3);
      encoded_str_00 =
           (in_addr_t *)
           (encoded_str + (ulong)this->kDnsDatalenSize + (ulong)this->kDnsTtlSize + lVar3);
      if (uVar1 == 0x100) {
        addr.s_addr = *encoded_str_00;
        inet_ntop(2,&addr,ip_str,0x10);
        std::__cxx11::string::string((string *)&local_d8,ip_str,&local_105);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ip_result,
                   &local_d8);
LAB_00117658:
        std::__cxx11::string::~string((string *)&local_d8);
      }
      else if ((ushort)(uVar1 << 8 | uVar1 >> 8) == this->kDnsTypeCname) {
        bVar4 = DecodeDotStr(this,(char *)encoded_str_00,&encoded_name_len,dot_name,0x80,recv_data);
        if (!bVar4) {
          return bVar7;
        }
        std::__cxx11::string::string((string *)&local_d8,dot_name,(allocator *)ip_str);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)cname_result
                   ,&local_d8);
        goto LAB_00117658;
      }
      encoded_str = (char *)((long)encoded_str_00 + (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8));
    }
  }
  return bVar7;
}

Assistant:

bool DNSResolve::ParseResponse(
    char* recv_data,
    string& hostname,
    vector<string>& ip_result,
    vector<string>& cname_result)
{
    char dot_name[128] = { '\0' };
    uint16_t encoded_name_len = 0;

    DNSHeader *dns_header = (DNSHeader*)recv_data;
    uint16_t question_count = 0;
    uint16_t answer_count = 0;

    if ((ntohs(dns_header->flags) & 0xfb7f) == 0x8100 //RFC1035 4.1.1(Header section format)
            && (question_count = ntohs(dns_header->question_count)) >= 0
            && (answer_count = ntohs(dns_header->answer_count)) > 0)
    {
        char *dns_data = recv_data + sizeof(DNSHeader);

        //resolve Question fields
        for (int question_index = 0; question_index != question_count; ++question_index)
        {
            if (!DecodeDotStr(dns_data, &encoded_name_len, dot_name, sizeof(dot_name)))
            {
                return false;
            }
            if (hostname.empty() && strlen(dot_name) > 0)
            {
                hostname = dot_name;
            }
            dns_data += (encoded_name_len + kDnsTypeSize + kDnsClassSzie);
        }

        //resolve Answer fields
        for (int answer_index = 0; answer_index != answer_count; ++answer_index)
        {
            if (!DecodeDotStr(dns_data, &encoded_name_len, dot_name, sizeof(dot_name), recv_data))
            {
                return false;
            }
            dns_data += encoded_name_len;

            uint16_t answer_type = ntohs(*(uint16_t*)(dns_data));
            uint16_t answer_class = ntohs(*(uint16_t*)(dns_data + kDnsTypeSize));
            uint32_t answer_ttl = ntohl(*(uint32_t*)(dns_data + kDnsTypeSize + kDnsClassSzie));
            uint16_t answer_data_len = ntohs(*(uint16_t*)(dns_data + kDnsTypeSize + kDnsClassSzie + kDnsTtlSize));
            dns_data += (kDnsTypeSize + kDnsClassSzie + kDnsTtlSize + kDnsDatalenSize);

            if (answer_type == kDnsTypeA)
            {
                in_addr addr;
                addr.s_addr = *(u_long*)dns_data;
                char ip_str[16];
                inet_ntop(AF_INET, &addr, ip_str, 16);
                ip_result.push_back(ip_str);
            }
            else if (answer_type == kDnsTypeCname)
            {
                if (!DecodeDotStr(dns_data, &encoded_name_len, dot_name, sizeof(dot_name), recv_data))
                {
                    return false;
                }
                cname_result.push_back(dot_name);
            }
            dns_data += (answer_data_len);
        }
    }
    return true;
}